

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O0

void __thiscall
cmELFInternalImpl<cmELFTypes64>::cmELFInternalImpl
          (cmELFInternalImpl<cmELFTypes64> *this,cmELF *external,
          unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
          *fin,ByteOrderType order)

{
  bool bVar1;
  uint uVar2;
  ostream *this_00;
  char *msg;
  ushort local_1d2;
  string local_1d0 [6];
  ELF_Half i;
  undefined1 local_1b0 [8];
  ostringstream e;
  uint eti;
  ByteOrderType order_local;
  unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  *fin_local;
  cmELF *external_local;
  cmELFInternalImpl<cmELFTypes64> *this_local;
  
  cmELFInternal::cmELFInternal(&this->super_cmELFInternal,external,fin,order);
  (this->super_cmELFInternal)._vptr_cmELFInternal = (_func_int **)&PTR__cmELFInternalImpl_00af77b8;
  std::vector<Elf64_Shdr,_std::allocator<Elf64_Shdr>_>::vector(&this->SectionHeaders);
  std::vector<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>::vector(&this->DynamicSectionEntries);
  bVar1 = Read(this,&this->ELFHeader);
  if (bVar1) {
    switch((this->ELFHeader).e_type) {
    case 0:
      cmELFInternal::SetErrorMessage(&this->super_cmELFInternal,"ELF file type is NONE.");
      return;
    case 1:
      (this->super_cmELFInternal).ELFType = FileTypeRelocatableObject;
      break;
    case 2:
      (this->super_cmELFInternal).ELFType = FileTypeExecutable;
      break;
    case 3:
      (this->super_cmELFInternal).ELFType = FileTypeSharedLibrary;
      break;
    case 4:
      (this->super_cmELFInternal).ELFType = FileTypeCore;
      break;
    default:
      uVar2 = (uint)(this->ELFHeader).e_type;
      if ((uVar2 < 0xfe00) || (0xfeff < uVar2)) {
        if ((uVar2 < 0xff00) || (0xffff < uVar2)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
          this_00 = std::operator<<((ostream *)local_1b0,"Unknown ELF file type ");
          std::ostream::operator<<(this_00,uVar2);
          std::__cxx11::ostringstream::str();
          msg = (char *)std::__cxx11::string::c_str();
          cmELFInternal::SetErrorMessage(&this->super_cmELFInternal,msg);
          std::__cxx11::string::~string(local_1d0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
          return;
        }
        (this->super_cmELFInternal).ELFType = FileTypeSpecificProc;
      }
      else {
        (this->super_cmELFInternal).ELFType = FileTypeSpecificOS;
      }
    }
    std::vector<Elf64_Shdr,_std::allocator<Elf64_Shdr>_>::resize
              (&this->SectionHeaders,(ulong)(this->ELFHeader).e_shnum);
    for (local_1d2 = 0; local_1d2 < (this->ELFHeader).e_shnum; local_1d2 = local_1d2 + 1) {
      bVar1 = LoadSectionHeader(this,local_1d2);
      if (!bVar1) {
        cmELFInternal::SetErrorMessage(&this->super_cmELFInternal,"Failed to load section headers.")
        ;
        return;
      }
    }
  }
  else {
    cmELFInternal::SetErrorMessage(&this->super_cmELFInternal,"Failed to read main ELF header.");
  }
  return;
}

Assistant:

cmELFInternalImpl<Types>::cmELFInternalImpl(
  cmELF* external, std::unique_ptr<cmsys::ifstream>& fin, ByteOrderType order)
  : cmELFInternal(external, fin, order)
{
  // Read the main header.
  if (!this->Read(this->ELFHeader)) {
    this->SetErrorMessage("Failed to read main ELF header.");
    return;
  }

  // Determine the ELF file type.
  switch (this->ELFHeader.e_type) {
    case ET_NONE:
      this->SetErrorMessage("ELF file type is NONE.");
      return;
    case ET_REL:
      this->ELFType = cmELF::FileTypeRelocatableObject;
      break;
    case ET_EXEC:
      this->ELFType = cmELF::FileTypeExecutable;
      break;
    case ET_DYN:
      this->ELFType = cmELF::FileTypeSharedLibrary;
      break;
    case ET_CORE:
      this->ELFType = cmELF::FileTypeCore;
      break;
    default: {
      unsigned int eti = static_cast<unsigned int>(this->ELFHeader.e_type);
#if defined(ET_LOOS) && defined(ET_HIOS)
      if (eti >= ET_LOOS && eti <= ET_HIOS) {
        this->ELFType = cmELF::FileTypeSpecificOS;
        break;
      }
#endif
#if defined(ET_LOPROC) && defined(ET_HIPROC)
      if (eti >= ET_LOPROC && eti <= ET_HIPROC) {
        this->ELFType = cmELF::FileTypeSpecificProc;
        break;
      }
#endif
      std::ostringstream e;
      e << "Unknown ELF file type " << eti;
      this->SetErrorMessage(e.str().c_str());
      return;
    }
  }

  // Load the section headers.
  this->SectionHeaders.resize(this->ELFHeader.e_shnum);
  for (ELF_Half i = 0; i < this->ELFHeader.e_shnum; ++i) {
    if (!this->LoadSectionHeader(i)) {
      this->SetErrorMessage("Failed to load section headers.");
      return;
    }
  }
}